

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.h
# Opt level: O1

int secp256k1_musig_aggnonce_parse
              (secp256k1_context *ctx,secp256k1_musig_aggnonce *nonce,uchar *in66)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  uchar *p2;
  uchar *puVar7;
  secp256k1_ge *psVar8;
  long lVar9;
  bool bVar10;
  secp256k1_ge ges [2];
  byte local_128 [48];
  secp256k1_ge local_f8 [2];
  
  if (ctx == (secp256k1_context *)0x0) {
    secp256k1_musig_aggnonce_parse_cold_3();
  }
  else if (nonce != (secp256k1_musig_aggnonce *)0x0) {
    if (in66 == (uchar *)0x0) {
      secp256k1_musig_aggnonce_parse_cold_1();
      return 0;
    }
    lVar9 = 0;
    puVar7 = in66;
    do {
      uVar4 = lVar9 * 0x68;
      psVar8 = local_f8 + lVar9;
      local_128[0x10] = 0;
      local_128[0x11] = 0;
      local_128[0x12] = 0;
      local_128[0x13] = 0;
      local_128[0x14] = 0;
      local_128[0x15] = 0;
      local_128[0x16] = 0;
      local_128[0x17] = 0;
      local_128[0x18] = 0;
      local_128[0x19] = 0;
      local_128[0x1a] = 0;
      local_128[0x1b] = 0;
      local_128[0x1c] = 0;
      local_128[0x1d] = 0;
      local_128[0x1e] = 0;
      local_128[0x1f] = 0;
      local_128[0] = 0;
      local_128[1] = 0;
      local_128[2] = 0;
      local_128[3] = 0;
      local_128[4] = 0;
      local_128[5] = 0;
      local_128[6] = 0;
      local_128[7] = 0;
      local_128[8] = 0;
      local_128[9] = 0;
      local_128[10] = 0;
      local_128[0xb] = 0;
      local_128[0xc] = 0;
      local_128[0xd] = 0;
      local_128[0xe] = 0;
      local_128[0xf] = 0;
      local_128[0x20] = 0;
      lVar5 = 0;
      do {
        uVar6 = uVar4 & 0xffffffff;
        bVar1 = puVar7[lVar5];
        bVar2 = local_128[lVar5];
        uVar4 = (ulong)((uint)bVar1 - (uint)bVar2);
        if (bVar1 == bVar2) {
          uVar4 = uVar6;
        }
        iVar3 = (int)uVar4;
        if (bVar1 != bVar2) goto LAB_00125b2e;
        lVar5 = lVar5 + 1;
      } while (lVar5 != 0x21);
      iVar3 = 0;
LAB_00125b2e:
      if (iVar3 == 0) {
        secp256k1_ge_set_infinity(psVar8);
      }
      else {
        iVar3 = secp256k1_eckey_pubkey_parse(psVar8,in66 + lVar9 * 0x21,0x21);
        if (iVar3 == 0) {
          return 0;
        }
        secp256k1_ge_verify(psVar8);
      }
      puVar7 = puVar7 + 0x21;
      bVar10 = lVar9 != 0;
      lVar9 = lVar9 + 1;
      if (bVar10) {
        nonce->data[0] = 0xa8;
        nonce->data[1] = 0xb7;
        nonce->data[2] = 0xe4;
        nonce->data[3] = 'g';
        psVar8 = local_f8;
        lVar9 = 0;
        do {
          secp256k1_ge_to_bytes_ext(nonce->data + lVar9 + 4,psVar8);
          lVar9 = lVar9 + 0x40;
          psVar8 = psVar8 + 1;
        } while (lVar9 == 0x40);
        return 1;
      }
    } while( true );
  }
  secp256k1_musig_aggnonce_parse_cold_2();
  return 0;
}

Assistant:

int secp256k1_musig_aggnonce_parse(const secp256k1_context* ctx, secp256k1_musig_aggnonce* nonce, const unsigned char *in66) {
    secp256k1_ge ges[2];
    int i;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(nonce != NULL);
    ARG_CHECK(in66 != NULL);

    for (i = 0; i < 2; i++) {
        if (!secp256k1_musig_ge_parse_ext(&ges[i], &in66[33*i])) {
            return 0;
        }
    }
    secp256k1_musig_aggnonce_save(nonce, ges);
    return 1;
}